

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O0

void __thiscall cmCTestHandlerCommand::cmCTestHandlerCommand(cmCTestHandlerCommand *this)

{
  reference ppcVar1;
  value_type local_38 [3];
  ulong local_20;
  size_t cc;
  size_t INIT_SIZE;
  cmCTestHandlerCommand *this_local;
  
  INIT_SIZE = (size_t)this;
  cmCTestCommand::cmCTestCommand(&this->super_cmCTestCommand);
  (this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_00a86940;
  std::__cxx11::string::string((string *)&this->ReturnVariable);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->Arguments);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->Values);
  cc = 100;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(&this->Arguments,100);
  for (local_20 = 0; local_20 < 100; local_20 = local_20 + 1) {
    local_38[0] = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&this->Arguments,local_38);
  }
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&this->Arguments,1)
  ;
  *ppcVar1 = "RETURN_VALUE";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&this->Arguments,2)
  ;
  *ppcVar1 = "CAPTURE_CMAKE_ERROR";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&this->Arguments,4)
  ;
  *ppcVar1 = "SOURCE";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&this->Arguments,3)
  ;
  *ppcVar1 = "BUILD";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&this->Arguments,5)
  ;
  *ppcVar1 = "SUBMIT_INDEX";
  this->Last = 6;
  this->AppendXML = false;
  this->Quiet = false;
  return;
}

Assistant:

cmCTestHandlerCommand::cmCTestHandlerCommand()
{
  const size_t INIT_SIZE = 100;
  size_t cc;
  this->Arguments.reserve(INIT_SIZE);
  for (cc = 0; cc < INIT_SIZE; ++cc) {
    this->Arguments.push_back(nullptr);
  }
  this->Arguments[ct_RETURN_VALUE] = "RETURN_VALUE";
  this->Arguments[ct_CAPTURE_CMAKE_ERROR] = "CAPTURE_CMAKE_ERROR";
  this->Arguments[ct_SOURCE] = "SOURCE";
  this->Arguments[ct_BUILD] = "BUILD";
  this->Arguments[ct_SUBMIT_INDEX] = "SUBMIT_INDEX";
  this->Last = ct_LAST;
  this->AppendXML = false;
  this->Quiet = false;
}